

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * units::getMultiplierString_abi_cxx11_(double multiplier,bool numOnly)

{
  bool bVar1;
  _Setprecision _Var2;
  ostream *this;
  size_type sVar3;
  byte in_SIL;
  string *in_RDI;
  double in_XMM0_Qa;
  __string_type rv;
  stringstream ss;
  int P;
  const_iterator si;
  unordered_map<float,_char,_std::hash<float>,_std::equal_to<float>,_std::allocator<std::pair<const_float,_char>_>_>
  *in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  allocator<char> *in_stack_fffffffffffffda8;
  undefined7 in_stack_fffffffffffffdb0;
  char in_stack_fffffffffffffdb7;
  size_type in_stack_fffffffffffffdb8;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  ostream *__a;
  undefined4 in_stack_fffffffffffffddc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  allocator<char> local_202;
  allocator<char> local_201;
  undefined4 local_200;
  allocator<char> local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  int local_1d4;
  stringstream local_1d0 [16];
  ostream local_1c0 [376];
  int local_48;
  allocator<char> local_31;
  _Node_iterator_base<std::pair<const_float,_char>,_false> local_30;
  float local_24;
  _Node_iterator_base<std::pair<const_float,_char>,_false> local_20;
  byte local_11;
  double local_10;
  
  local_11 = in_SIL & 1;
  if ((in_XMM0_Qa == 1.0) && (!NAN(in_XMM0_Qa))) {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
    return in_RDI;
  }
  local_10 = in_XMM0_Qa;
  if (local_11 == 0) {
    local_24 = (float)in_XMM0_Qa;
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_map<float,_char,_std::hash<float>,_std::equal_to<float>,_std::allocator<std::pair<const_float,_char>_>_>
         ::find(in_stack_fffffffffffffd98,(key_type *)0x736321);
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<float,_char,_std::hash<float>,_std::equal_to<float>,_std::allocator<std::pair<const_float,_char>_>_>
         ::end(in_stack_fffffffffffffd98);
    bVar1 = std::__detail::operator==(&local_20,&local_30);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::__detail::_Node_const_iterator<std::pair<const_float,_char>,_false,_false>::operator->
                ((_Node_const_iterator<std::pair<const_float,_char>,_false,_false> *)0x736367);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                 in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb7,in_stack_fffffffffffffda8);
      std::allocator<char>::~allocator(&local_31);
      return in_RDI;
    }
  }
  local_48 = 0x12;
  std::__cxx11::stringstream::stringstream(local_1d0);
  __a = local_1c0;
  _Var2 = std::setprecision(local_48);
  local_1d4 = _Var2._M_n;
  this = std::operator<<(__a,_Var2);
  std::ostream::operator<<(this,local_10);
  std::__cxx11::stringstream::str();
  sVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (&local_1f8);
  if (sVar3 < 5) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                            (char *)in_stack_fffffffffffffd98);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffde0,(char *)CONCAT44(in_stack_fffffffffffffddc,_Var2._M_n),
                 (allocator<char> *)__a);
      std::allocator<char>::~allocator(&local_1f9);
      goto LAB_00736638;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                            (char *)in_stack_fffffffffffffd98);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffde0,(char *)CONCAT44(in_stack_fffffffffffffddc,_Var2._M_n),
                 (allocator<char> *)__a);
      std::allocator<char>::~allocator(&local_201);
      goto LAB_00736638;
    }
    in_stack_fffffffffffffda7 =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                         (char *)in_stack_fffffffffffffd98);
    if ((bool)in_stack_fffffffffffffda7) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffde0,(char *)CONCAT44(in_stack_fffffffffffffddc,_Var2._M_n),
                 (allocator<char> *)__a);
      std::allocator<char>::~allocator(&local_202);
      goto LAB_00736638;
    }
  }
  std::__cxx11::string::string
            (in_stack_fffffffffffffde0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffddc,_Var2._M_n));
LAB_00736638:
  local_200 = 1;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
  std::__cxx11::stringstream::~stringstream(local_1d0);
  return in_RDI;
}

Assistant:

static std::string getMultiplierString(double multiplier, bool numOnly = false)
{
    if (multiplier == 1.0) {
        return {};
    }
    if (!numOnly) {
        auto si = si_prefixes.find(static_cast<float>(multiplier));
        if (si != si_prefixes.end()) {
            // NOLINTNEXTLINE(
            return std::string(1UL, si->second);
        }
    }
    int P = 18;  // the desired precision
    std::stringstream ss;

    ss << std::setprecision(P) << multiplier;
    auto rv = ss.str();
    if (rv.size() <= 4) {
        // modify some improper strings that cause issues later on
        // some platforms don't produce these
        if (rv == "inf") {
            return "1.00000000000000*(infinity)";  // LCOV_EXCL_LINE
        }
        if (rv == "-inf") {
            return "1.00000000000000*(-1.00000000000000*infinity)";  // LCOV_EXCL_LINE
        }
        if (rv == "nan") {
            return "1.00000000000000*(nan)";  // LCOV_EXCL_LINE
        }
    }
    return rv;
}